

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepSubstring *
absl::lts_20250127::cord_internal::anon_unknown_0::CreateSubstring
          (CordRep *rep,size_t offset,size_t n)

{
  uint __line;
  byte bVar1;
  CordRepSubstring *pCVar2;
  char *__assertion;
  
  if (n == 0) {
    __assertion = "n != 0";
    __line = 0x76;
  }
  else if (rep->length < n + offset) {
    __assertion = "offset + n <= rep->length";
    __line = 0x77;
  }
  else {
    if (rep->length != n || offset != 0) {
      bVar1 = rep->tag;
      if (bVar1 == 1) {
        pCVar2 = CordRep::substring(rep);
        offset = offset + pCVar2->start;
        rep = CordRep::Ref(pCVar2->child);
        CordRep::Unref(&pCVar2->super_CordRep);
        bVar1 = rep->tag;
      }
      if (4 < bVar1) {
        pCVar2 = (CordRepSubstring *)operator_new(0x20);
        (pCVar2->super_CordRep).length = 0;
        (pCVar2->super_CordRep).refcount = (atomic<int>)0x0;
        (pCVar2->super_CordRep).tag = '\0';
        (pCVar2->super_CordRep).storage[0] = '\0';
        (pCVar2->super_CordRep).storage[1] = '\0';
        (pCVar2->super_CordRep).storage[2] = '\0';
        (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar2->super_CordRep).length = n;
        (pCVar2->super_CordRep).tag = '\x01';
        pCVar2->start = offset;
        pCVar2->child = rep;
        return pCVar2;
      }
      __assert_fail("rep->IsExternal() || rep->IsFlat()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x80,
                    "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                   );
    }
    __assertion = "offset != 0 || n != rep->length";
    __line = 0x78;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,__line,
                "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
               );
}

Assistant:

CordRepSubstring* CreateSubstring(CordRep* rep, size_t offset, size_t n) {
  assert(n != 0);
  assert(offset + n <= rep->length);
  assert(offset != 0 || n != rep->length);

  if (rep->tag == SUBSTRING) {
    CordRepSubstring* substring = rep->substring();
    offset += substring->start;
    rep = CordRep::Ref(substring->child);
    CordRep::Unref(substring);
  }
  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = rep;
  return substring;
}